

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode ZSTD_XXH64_update(XXH64_state_t *state,void *input,size_t len)

{
  xxh_u8 *pxVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u8 *p;
  size_t len_local;
  void *input_local;
  XXH64_state_t *state_local;
  
  if (input != (void *)0x0) {
    pxVar1 = (xxh_u8 *)((long)input + len);
    state->total_len = len + state->total_len;
    if (state->memsize + len < 0x20) {
      XXH_memcpy((void *)((long)state->mem64 + (ulong)state->memsize),input,len);
      state->memsize = (int)len + state->memsize;
    }
    else {
      bEnd = (xxh_u8 *)input;
      if (state->memsize != 0) {
        XXH_memcpy((void *)((long)state->mem64 + (ulong)state->memsize),input,
                   (ulong)(0x20 - state->memsize));
        xVar3 = state->v[0];
        xVar2 = XXH_readLE64(state->mem64);
        xVar3 = XXH64_round(xVar3,xVar2);
        state->v[0] = xVar3;
        xVar3 = state->v[1];
        xVar2 = XXH_readLE64(state->mem64 + 1);
        xVar3 = XXH64_round(xVar3,xVar2);
        state->v[1] = xVar3;
        xVar3 = state->v[2];
        xVar2 = XXH_readLE64(state->mem64 + 2);
        xVar3 = XXH64_round(xVar3,xVar2);
        state->v[2] = xVar3;
        xVar3 = state->v[3];
        xVar2 = XXH_readLE64(state->mem64 + 3);
        xVar3 = XXH64_round(xVar3,xVar2);
        state->v[3] = xVar3;
        bEnd = (xxh_u8 *)((long)input + (ulong)(0x20 - state->memsize));
        state->memsize = 0;
      }
      if (bEnd + 0x20 <= pxVar1) {
        do {
          xVar3 = state->v[0];
          xVar2 = XXH_readLE64(bEnd);
          xVar3 = XXH64_round(xVar3,xVar2);
          state->v[0] = xVar3;
          xVar3 = state->v[1];
          xVar2 = XXH_readLE64(bEnd + 8);
          xVar3 = XXH64_round(xVar3,xVar2);
          state->v[1] = xVar3;
          xVar3 = state->v[2];
          xVar2 = XXH_readLE64(bEnd + 0x10);
          xVar3 = XXH64_round(xVar3,xVar2);
          state->v[2] = xVar3;
          xVar3 = state->v[3];
          xVar2 = XXH_readLE64(bEnd + 0x18);
          xVar3 = XXH64_round(xVar3,xVar2);
          state->v[3] = xVar3;
          bEnd = bEnd + 0x20;
        } while (bEnd <= pxVar1 + -0x20);
      }
      if (bEnd < pxVar1) {
        XXH_memcpy(state->mem64,bEnd,(long)pxVar1 - (long)bEnd);
        state->memsize = (int)pxVar1 - (int)bEnd;
      }
    }
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH64_update (XXH64_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len += len;

        if (state->memsize + len < 32) {  /* fill in tmp buffer */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
            state->memsize += (xxh_u32)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* tmp buffer is full */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, 32-state->memsize);
            state->v[0] = XXH64_round(state->v[0], XXH_readLE64(state->mem64+0));
            state->v[1] = XXH64_round(state->v[1], XXH_readLE64(state->mem64+1));
            state->v[2] = XXH64_round(state->v[2], XXH_readLE64(state->mem64+2));
            state->v[3] = XXH64_round(state->v[3], XXH_readLE64(state->mem64+3));
            p += 32 - state->memsize;
            state->memsize = 0;
        }

        if (p+32 <= bEnd) {
            const xxh_u8* const limit = bEnd - 32;

            do {
                state->v[0] = XXH64_round(state->v[0], XXH_readLE64(p)); p+=8;
                state->v[1] = XXH64_round(state->v[1], XXH_readLE64(p)); p+=8;
                state->v[2] = XXH64_round(state->v[2], XXH_readLE64(p)); p+=8;
                state->v[3] = XXH64_round(state->v[3], XXH_readLE64(p)); p+=8;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem64, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}